

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::NetworkAddressImpl::connectAuthenticated(NetworkAddressImpl *this)

{
  void *__src;
  LowLevelAsyncIoProvider node;
  void *__dest;
  long in_RSI;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs;
  Array<kj::(anonymous_namespace)::SocketAddress> addrsCopy;
  Promise<kj::AuthenticatedStream> promise;
  size_t capacity;
  LowLevelAsyncIoProvider local_30;
  
  __src = *(void **)(in_RSI + 0x18);
  capacity = *(size_t *)(in_RSI + 0x20);
  __dest = kj::_::HeapArrayDisposer::allocateImpl
                     (0x88,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  if (capacity != 0) {
    memcpy(__dest,__src,capacity * 0x88);
  }
  addrs.size_ = (size_t)__dest;
  addrs.ptr = *(SocketAddress **)(in_RSI + 0x10);
  connectImpl(&local_30,*(NetworkFilter **)(in_RSI + 8),addrs,SUB81(capacity,0));
  Promise<kj::AuthenticatedStream>::attach<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Promise<kj::AuthenticatedStream> *)this,
             (Array<kj::(anonymous_namespace)::SocketAddress> *)&local_30);
  node._vptr_LowLevelAsyncIoProvider = local_30._vptr_LowLevelAsyncIoProvider;
  if ((PromiseArenaMember *)local_30._vptr_LowLevelAsyncIoProvider != (PromiseArenaMember *)0x0) {
    local_30._vptr_LowLevelAsyncIoProvider = (_func_int **)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node._vptr_LowLevelAsyncIoProvider);
  }
  if (__dest != (void *)0x0) {
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__dest,0x88,capacity,
               capacity,(_func_void_void_ptr *)0x0);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> connectAuthenticated() override {
    auto addrsCopy = heapArray(addrs.asPtr());
    auto promise = connectImpl(lowLevel, filter, addrsCopy, true);
    return promise.attach(kj::mv(addrsCopy));
  }